

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fork.c
# Opt level: O3

void run_timer_loop_once(void)

{
  int iVar1;
  uint uVar2;
  uint child_pid;
  __pid_t child_pid_00;
  undefined1 *puVar3;
  ssize_t sVar4;
  undefined1 *puVar5;
  undefined8 uVar6;
  uint extraout_EDX;
  uint uVar7;
  undefined1 *puVar8;
  uv_timer_t timer_handle;
  undefined1 uStack_259;
  int iStack_258;
  int iStack_254;
  int iStack_250;
  int iStack_24c;
  undefined1 auStack_248 [160];
  code *pcStack_1a8;
  undefined1 *puStack_198;
  code *pcStack_190;
  int iStack_180;
  uint uStack_17c;
  undefined1 auStack_178 [160];
  code *pcStack_d8;
  uint uStack_c4;
  undefined1 *puStack_c0;
  undefined1 local_a0 [152];
  
  puVar3 = (undefined1 *)uv_default_loop();
  timer_cb_called = 0;
  puVar8 = puVar3;
  iVar1 = uv_timer_init(puVar3,local_a0);
  if (iVar1 == 0) {
    puVar8 = local_a0;
    iVar1 = uv_timer_start(puVar8,timer_cb,1,0);
    if (iVar1 != 0) goto LAB_0014ed7e;
    puVar8 = puVar3;
    iVar1 = uv_run(puVar3,0);
    if (iVar1 != 0) goto LAB_0014ed83;
    if (timer_cb_called == 1) {
      return;
    }
  }
  else {
    run_timer_loop_once_cold_1();
LAB_0014ed7e:
    run_timer_loop_once_cold_2();
LAB_0014ed83:
    run_timer_loop_once_cold_3();
  }
  run_timer_loop_once_cold_4();
  puVar5 = (undefined1 *)((ulong)puVar8 & 0xffffffff);
  pcStack_d8 = (code *)0x14eda6;
  puStack_c0 = puVar3;
  uVar2 = waitpid((uint)puVar8,(int *)&uStack_c4,0);
  pcStack_d8 = (code *)0x14edbb;
  printf("Waited pid is %d with status %d\n",(ulong)uVar2,(ulong)uStack_c4);
  if (uVar2 == 0xffffffff) {
    pcStack_d8 = (code *)0x14ede8;
    perror("Failed to wait");
  }
  if (uVar2 == (uint)puVar8) {
    if ((uStack_c4 & 0x7f) != 0) goto LAB_0014edef;
    if ((uStack_c4 & 0xff00) == 0) {
      return;
    }
  }
  else {
    pcStack_d8 = (code *)0x14edef;
    assert_wait_child_cold_1();
LAB_0014edef:
    pcStack_d8 = (code *)0x14edf4;
    assert_wait_child_cold_2();
  }
  pcStack_d8 = run_test_fork_socketpair;
  assert_wait_child_cold_3();
  pcStack_190 = (code *)0x14ee06;
  pcStack_d8 = (code *)puVar5;
  run_timer_loop_once();
  puVar8 = (undefined1 *)0x1;
  uVar7 = 1;
  pcStack_190 = (code *)0x14ee1c;
  iVar1 = socketpair(1,1,0,&iStack_180);
  if (iVar1 == 0) {
    pcStack_190 = (code *)0x14ee29;
    puVar8 = (undefined1 *)uv_default_loop();
    puVar3 = auStack_178;
    pcStack_190 = (code *)0x14ee3a;
    iVar1 = uv_poll_init(puVar8,puVar3,iStack_180);
    uVar7 = (uint)puVar3;
    if (iVar1 != 0) goto LAB_0014ef2c;
    pcStack_190 = (code *)0x14ee47;
    child_pid = fork();
    if (child_pid != 0) {
      puVar5 = (undefined1 *)(ulong)child_pid;
      if (child_pid == 0xffffffff) goto LAB_0014ef36;
      puVar8 = (undefined1 *)(ulong)uStack_17c;
      uVar7 = 0x18271a;
      pcStack_190 = (code *)0x14ee6d;
      sVar4 = send(uStack_17c,"hi\n",3,0);
      if (sVar4 == 3) {
        pcStack_190 = (code *)0x14ee7e;
        assert_wait_child(child_pid);
LAB_0014eee8:
        pcStack_190 = (code *)0x14eeed;
        puVar5 = (undefined1 *)uv_default_loop();
        pcStack_190 = (code *)0x14ef01;
        uv_walk(puVar5,close_walk_cb,0);
        uVar7 = 0;
        pcStack_190 = (code *)0x14ef0b;
        uv_run(puVar5);
        pcStack_190 = (code *)0x14ef10;
        puVar8 = (undefined1 *)uv_default_loop();
        pcStack_190 = (code *)0x14ef18;
        iVar1 = uv_loop_close();
        if (iVar1 == 0) {
          return;
        }
        goto LAB_0014ef31;
      }
      goto LAB_0014ef3b;
    }
    pcStack_190 = (code *)0x14ee85;
    puVar8 = (undefined1 *)uv_default_loop();
    pcStack_190 = (code *)0x14ee8d;
    iVar1 = uv_loop_fork();
    if (iVar1 != 0) goto LAB_0014ef40;
    if (socket_cb_called != 0) goto LAB_0014ef45;
    puVar8 = auStack_178;
    uVar7 = 1;
    pcStack_190 = (code *)0x14eeb8;
    iVar1 = uv_poll_start(puVar8,1,socket_cb);
    if (iVar1 != 0) goto LAB_0014ef4a;
    pcStack_190 = (code *)0x14eecc;
    puts("Going to run the loop in the child");
    pcStack_190 = (code *)0x14eed1;
    puVar8 = (undefined1 *)uv_default_loop();
    uVar7 = 0;
    pcStack_190 = (code *)0x14eedb;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0014ef4f;
    if (socket_cb_called == 1) goto LAB_0014eee8;
  }
  else {
    pcStack_190 = (code *)0x14ef2c;
    run_test_fork_socketpair_cold_1();
LAB_0014ef2c:
    pcStack_190 = (code *)0x14ef31;
    run_test_fork_socketpair_cold_2();
LAB_0014ef31:
    pcStack_190 = (code *)0x14ef36;
    run_test_fork_socketpair_cold_10();
LAB_0014ef36:
    pcStack_190 = (code *)0x14ef3b;
    run_test_fork_socketpair_cold_8();
LAB_0014ef3b:
    pcStack_190 = (code *)0x14ef40;
    run_test_fork_socketpair_cold_9();
LAB_0014ef40:
    pcStack_190 = (code *)0x14ef45;
    run_test_fork_socketpair_cold_3();
LAB_0014ef45:
    pcStack_190 = (code *)0x14ef4a;
    run_test_fork_socketpair_cold_4();
LAB_0014ef4a:
    pcStack_190 = (code *)0x14ef4f;
    run_test_fork_socketpair_cold_5();
LAB_0014ef4f:
    pcStack_190 = (code *)0x14ef54;
    run_test_fork_socketpair_cold_6();
  }
  pcStack_190 = socket_cb;
  run_test_fork_socketpair_cold_7();
  socket_cb_called = socket_cb_called + 1;
  puStack_198 = puVar5;
  pcStack_190 = (code *)(ulong)uVar2;
  if (uVar7 == 0) {
    pcStack_1a8 = (code *)0x14ef7b;
    uVar7 = extraout_EDX;
    printf("Socket cb got events %d\n");
    puVar5 = puVar8;
    if ((extraout_EDX & 1) == 0) goto LAB_0014efc7;
    if (socket_cb_read_fd == 0) {
LAB_0014efb2:
      uv_close(puVar8,0);
      return;
    }
    uVar7 = 0x2e0290;
    pcStack_1a8 = (code *)0x14efa2;
    sVar4 = read(socket_cb_read_fd,socket_cb_read_buf,(ulong)socket_cb_read_size * 3);
    if (sVar4 == (ulong)socket_cb_read_size * 3) goto LAB_0014efb2;
  }
  else {
    pcStack_1a8 = (code *)0x14efc7;
    socket_cb_cold_1();
LAB_0014efc7:
    pcStack_1a8 = (code *)0x14efcc;
    socket_cb_cold_3();
  }
  pcStack_1a8 = run_test_fork_socketpair_started;
  socket_cb_cold_2();
  pcStack_1a8 = (code *)puVar5;
  iVar1 = pipe(&iStack_250);
  if (iVar1 == 0) {
    run_timer_loop_once();
    uVar7 = 1;
    iVar1 = socketpair(1,1,0,&iStack_258);
    if (iVar1 != 0) goto LAB_0014f22d;
    uVar6 = uv_default_loop();
    puVar8 = auStack_248;
    iVar1 = uv_poll_init(uVar6,puVar8,iStack_258);
    uVar7 = (uint)puVar8;
    if (iVar1 != 0) goto LAB_0014f232;
    uVar7 = 1;
    iVar1 = uv_poll_start(auStack_248,1,socket_cb);
    if (iVar1 != 0) goto LAB_0014f237;
    uVar6 = uv_default_loop();
    uVar7 = 2;
    iVar1 = uv_run(uVar6);
    if (iVar1 != 1) goto LAB_0014f23c;
    child_pid_00 = fork();
    if (child_pid_00 != 0) {
      if (child_pid_00 == -1) goto LAB_0014f246;
      iVar1 = uv_poll_stop(auStack_248);
      if (iVar1 != 0) goto LAB_0014f24b;
      uv_close(auStack_248);
      uVar6 = uv_default_loop();
      uVar7 = 0;
      iVar1 = uv_run(uVar6);
      if (iVar1 != 0) goto LAB_0014f255;
      if (socket_cb_called != 0) goto LAB_0014f25f;
      uVar7 = 0x18323c;
      sVar4 = write(iStack_24c,"1",1);
      if (sVar4 != 1) goto LAB_0014f269;
      uVar7 = 0x18271a;
      sVar4 = send(iStack_254,"hi\n",3,0);
      if (sVar4 != 3) goto LAB_0014f273;
      uVar6 = uv_default_loop();
      uVar7 = 0;
      iVar1 = uv_run(uVar6);
      if (iVar1 == 0) {
        if (socket_cb_called != 0) goto LAB_0014f287;
        assert_wait_child(child_pid_00);
        goto LAB_0014f1e9;
      }
      goto LAB_0014f27d;
    }
    uVar2 = getpid();
    printf("Child is %d\n",(ulong)uVar2);
    puVar8 = &uStack_259;
    sVar4 = read(iStack_250,puVar8,1);
    uVar7 = (uint)puVar8;
    if (sVar4 != 1) goto LAB_0014f250;
    uVar6 = uv_default_loop();
    iVar1 = uv_loop_fork(uVar6);
    if (iVar1 != 0) goto LAB_0014f25a;
    if (socket_cb_called != 0) goto LAB_0014f264;
    puts("Going to run the loop in the child");
    socket_cb_read_fd = iStack_258;
    socket_cb_read_size = 1;
    uVar6 = uv_default_loop();
    uVar7 = 0;
    iVar1 = uv_run(uVar6);
    if (iVar1 != 0) goto LAB_0014f26e;
    if (socket_cb_called != 1) goto LAB_0014f278;
    uVar7 = 0x2e0290;
    printf("Buf %s\n");
    if (socket_cb_read_buf._0_4_ == 0xa6968) {
LAB_0014f1e9:
      uVar6 = uv_default_loop();
      uv_walk(uVar6,close_walk_cb,0);
      uVar7 = 0;
      uv_run(uVar6);
      uVar6 = uv_default_loop();
      iVar1 = uv_loop_close(uVar6);
      if (iVar1 == 0) {
        return;
      }
      goto LAB_0014f241;
    }
  }
  else {
    run_test_fork_socketpair_started_cold_1();
LAB_0014f22d:
    run_test_fork_socketpair_started_cold_2();
LAB_0014f232:
    run_test_fork_socketpair_started_cold_3();
LAB_0014f237:
    run_test_fork_socketpair_started_cold_4();
LAB_0014f23c:
    run_test_fork_socketpair_started_cold_5();
LAB_0014f241:
    run_test_fork_socketpair_started_cold_20();
LAB_0014f246:
    run_test_fork_socketpair_started_cold_12();
LAB_0014f24b:
    run_test_fork_socketpair_started_cold_13();
LAB_0014f250:
    run_test_fork_socketpair_started_cold_6();
LAB_0014f255:
    run_test_fork_socketpair_started_cold_14();
LAB_0014f25a:
    run_test_fork_socketpair_started_cold_7();
LAB_0014f25f:
    run_test_fork_socketpair_started_cold_15();
LAB_0014f264:
    run_test_fork_socketpair_started_cold_8();
LAB_0014f269:
    run_test_fork_socketpair_started_cold_16();
LAB_0014f26e:
    run_test_fork_socketpair_started_cold_9();
LAB_0014f273:
    run_test_fork_socketpair_started_cold_17();
LAB_0014f278:
    run_test_fork_socketpair_started_cold_10();
LAB_0014f27d:
    run_test_fork_socketpair_started_cold_18();
  }
  run_test_fork_socketpair_started_cold_11();
LAB_0014f287:
  run_test_fork_socketpair_started_cold_19();
  fork_signal_cb_called = uVar7;
  uv_close();
  return;
}

Assistant:

static void run_timer_loop_once(void) {
  uv_loop_t* loop;
  uv_timer_t timer_handle;

  loop = uv_default_loop();

  timer_cb_called = 0; /* Reset for the child. */

  ASSERT(0 == uv_timer_init(loop, &timer_handle));
  ASSERT(0 == uv_timer_start(&timer_handle, timer_cb, 1, 0));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
  ASSERT(1 == timer_cb_called);
}